

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::ResizeInternalTestLarge_TestInternalResizeChangeConfig_Test>
::CreateTest(ParameterizedTestFactory<(anonymous_namespace)::ResizeInternalTestLarge_TestInternalResizeChangeConfig_Test>
             *this)

{
  Test *this_00;
  long in_RDI;
  
  WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>::
  SetParam((ParamType *)(in_RDI + 8));
  this_00 = (Test *)operator_new(0x420);
  anon_unknown.dwarf_ccb0f7::ResizeInternalTestLarge_TestInternalResizeChangeConfig_Test::
  ResizeInternalTestLarge_TestInternalResizeChangeConfig_Test
            ((ResizeInternalTestLarge_TestInternalResizeChangeConfig_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }